

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O3

error_code __thiscall
anon_unknown.dwarf_31dc5a::_remove_all_r
          (anon_unknown_dwarf_31dc5a *this,StringRef path,file_type ft,uint32_t *count)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  error_category *peVar7;
  undefined8 extraout_RAX;
  undefined7 extraout_var;
  error_category *peVar9;
  uint *puVar10;
  Twine *extraout_RAX_00;
  Twine *pTVar11;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX_01;
  undefined4 in_register_0000000c;
  int *piVar12;
  error_category *extraout_RDX;
  error_category *extraout_RDX_00;
  ulong uVar13;
  error_code eVar14;
  StringRef SVar15;
  error_code eVar16;
  error_code ec;
  error_code ec_1;
  directory_iterator i;
  directory_iterator e;
  SmallString<128U> PathStorage;
  error_code local_1e0;
  StringRef local_1d0;
  undefined4 local_1c0 [2];
  error_category *local_1b8;
  uint local_1b0 [2];
  error_category *local_1a8;
  directory_iterator local_1a0;
  directory_iterator local_188;
  Child local_168;
  undefined8 local_160;
  Twine local_158 [5];
  Twine local_d8;
  stat local_c0;
  undefined8 uVar8;
  
  piVar12 = (int *)CONCAT44(in_register_0000000c,ft);
  local_1d0.Length = (size_t)path.Data;
  local_1d0.Data = (char *)this;
  if ((int)path.Length == 3) {
    local_1e0._M_value = 0;
    peVar7 = (error_category *)std::_V2::system_category();
    local_1e0._M_cat = peVar7;
    llvm::Twine::Twine((Twine *)&local_168,&local_1d0);
    llvm::sys::fs::directory_iterator::directory_iterator
              (&local_1a0,(Twine *)&local_168,&local_1e0,false);
    if (local_1e0._M_value == 0) {
      local_188.State.
      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_188.State.
      super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_188.FollowSymlinks = true;
      bVar1 = llvm::sys::fs::directory_iterator::operator==(&local_1a0,&local_188);
      uVar8 = CONCAT71(extraout_var,bVar1);
      if (!bVar1) {
        do {
          if (local_1e0._M_value != 0) {
            eVar16._M_cat = local_1e0._M_cat;
            eVar16._0_8_ = uVar8;
            uVar4 = local_1e0._M_value;
LAB_0016aaa0:
            if (local_188.State.
                super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_188.State.
                         super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
              eVar16._M_cat = eVar16._M_cat;
              eVar16._0_8_ = extraout_RAX_01;
            }
            goto LAB_0016a811;
          }
          llvm::Twine::Twine(&local_d8,
                             &((local_1a0.State.
                                super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->CurrentEntry).Path);
          local_168.twine = local_158;
          local_160 = 0x8000000000;
          SVar15 = llvm::Twine::toNullTerminatedStringRef
                             (&local_d8,(SmallVectorImpl<char> *)&local_168);
          iVar6 = llbuild::basic::sys::lstat(SVar15.Data,&local_c0);
          if (iVar6 == 0) {
            uVar13 = (ulong)((local_c0.st_mode & 0xf000) - 0x1000 >> 0xc);
            switch(uVar13) {
            case 0:
              uVar13 = 7;
              break;
            case 1:
              uVar13 = 6;
              break;
            default:
              uVar13 = 9;
              break;
            case 3:
            case 5:
              break;
            case 7:
              uVar13 = 2;
              break;
            case 9:
              uVar13 = 4;
              break;
            case 0xb:
              uVar13 = 8;
            }
            peVar9 = peVar7;
            uVar4 = 0;
          }
          else {
            puVar10 = (uint *)__errno_location();
            uVar4 = *puVar10;
            local_1b8 = (error_category *)std::_V2::generic_category();
            local_1c0[0] = 2;
            local_1b0[0] = uVar4;
            local_1a8 = local_1b8;
            cVar2 = (**(code **)(*(long *)local_1b8 + 0x30))(local_1b8,uVar4,local_1c0);
            if (cVar2 == '\0') {
              bVar3 = (**(code **)(*(long *)local_1b8 + 0x38))(local_1b8,local_1b0,local_1c0[0]);
              uVar13 = (ulong)bVar3;
              peVar9 = local_1a8;
              uVar4 = local_1b0[0];
            }
            else {
              uVar13 = 1;
              peVar9 = local_1a8;
              uVar4 = local_1b0[0];
            }
          }
          pTVar11 = local_158;
          if (local_168.twine != pTVar11) {
            free(local_168.twine);
            pTVar11 = extraout_RAX_00;
          }
          eVar16._M_cat = peVar9;
          eVar16._0_8_ = pTVar11;
          if (uVar4 != 0) goto LAB_0016aaa0;
          SVar15.Length = uVar13;
          SVar15.Data = (char *)((local_1a0.State.
                                  super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->CurrentEntry).Path._M_string_length;
          eVar16 = _remove_all_r((anon_unknown_dwarf_31dc5a *)
                                 ((local_1a0.State.
                                   super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->CurrentEntry).Path._M_dataplus._M_p,SVar15,ft,count);
          uVar4 = eVar16._M_value;
          if (uVar4 != 0) goto LAB_0016aaa0;
          eVar16 = llvm::sys::fs::detail::directory_iterator_increment
                             (local_1a0.State.
                              super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
          local_1e0._M_cat = eVar16._M_cat;
          local_1e0._M_value = eVar16._M_value;
          llvm::sys::fs::directory_iterator::update_error_code_for_current_entry
                    (&local_1a0,&local_1e0);
          bVar1 = llvm::sys::fs::directory_iterator::operator==(&local_1a0,&local_188);
          uVar8 = CONCAT71(extraout_var_00,bVar1);
        } while (!bVar1);
      }
      if (local_188.State.
          super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_188.State.
                   super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      llvm::Twine::Twine((Twine *)&local_168,&local_1d0);
      uVar4 = 0;
      uVar5 = llvm::sys::fs::remove((fs *)&local_168.character,(char *)0x0);
      peVar9 = extraout_RDX_00;
      if (uVar5 == 0) {
        *piVar12 = *piVar12 + 1;
        bVar1 = true;
      }
      else {
        bVar1 = false;
        uVar4 = uVar5;
      }
    }
    else {
      eVar16._M_cat = local_1e0._M_cat;
      eVar16._0_8_ = extraout_RAX;
      uVar4 = local_1e0._M_value;
LAB_0016a811:
      peVar9 = eVar16._M_cat;
      bVar1 = false;
    }
    if (local_1a0.State.
        super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a0.State.
                 super___shared_ptr<llvm::sys::fs::detail::DirIterState,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    uVar13 = (ulong)uVar4;
    if (bVar1) {
      uVar13 = 0;
      peVar9 = peVar7;
    }
  }
  else {
    llvm::Twine::Twine((Twine *)&local_168,&local_1d0);
    uVar13 = 0;
    uVar4 = llvm::sys::fs::remove((fs *)&local_168.character,(char *)0x0);
    if (uVar4 == 0) {
      *piVar12 = *piVar12 + 1;
      peVar9 = (error_category *)std::_V2::system_category();
    }
    else {
      uVar13 = (ulong)uVar4;
      peVar9 = extraout_RDX;
    }
  }
  eVar14._M_cat = peVar9;
  eVar14._0_8_ = uVar13;
  return eVar14;
}

Assistant:

error_code _remove_all_r(StringRef path, file_type ft, uint32_t &count) {
    if (ft == file_type::directory_file) {
      error_code ec;
      // For removal purposes, we should not follow through symlinks. Rather,
      // we just want to remove the symlink itself.
      directory_iterator i(path, ec, /* FollowSymlinks */ false);
      if (ec)
        return ec;

      for (directory_iterator e; i != e; i.increment(ec)) {
        if (ec)
          return ec;

        file_status st;

        if (error_code ec = link_status(i->path(), st))
          return ec;

        if (error_code ec = _remove_all_r(i->path(), st.type(), count))
          return ec;
      }

      if (error_code ec = remove(path, false))
        return ec;

      ++count; // Include the directory itself in the items removed.
    } else {
      if (error_code ec = remove(path, false))
        return ec;

      ++count;
    }

    return error_code();
  }